

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

void chatra::parseInnerNode
               (ParserWorkingSet *ws,IErrorReceiver *errorReceiver,
               shared_ptr<chatra::StringTable> *sTable,Node *node,bool recursive)

{
  __normal_iterator<const_chatra::Token_**,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
  first;
  __node_base_ptr *this;
  Token **__args_1;
  StringId SVar1;
  Token **ppTVar2;
  Token *pTVar3;
  Token *pTVar4;
  pointer psVar5;
  element_type *peVar6;
  undefined1 *puVar7;
  __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
  last;
  pointer psVar8;
  pointer psVar9;
  undefined8 *puVar10;
  char *pcVar11;
  Node *node_00;
  element_type *peVar12;
  element_type *peVar13;
  pointer ppTVar14;
  bool bVar15;
  iterator __first;
  iterator __position;
  mapped_type *pmVar16;
  element_type *peVar17;
  size_type *psVar18;
  __shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2> *p_Var19;
  iterator iVar20;
  undefined8 *puVar21;
  NodeType NVar22;
  ulong uVar23;
  shared_ptr<chatra::Node> *n_1;
  pointer ppTVar24;
  size_type *psVar25;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var26;
  long lVar27;
  __normal_iterator<const_chatra::Token_**,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
  _Var28;
  pointer n_00;
  string *message;
  undefined1 local_248 [8];
  AnnotationMap aMap;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_208;
  iterator local_200;
  Token **local_1e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d8;
  shared_ptr<chatra::StringTable> *local_1b8;
  IErrorReceiver *local_1b0;
  ParserWorkingSet *local_1a8;
  vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_> *local_1a0;
  undefined1 auStack_198 [8];
  vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_> pending;
  iterator local_178;
  undefined1 auStack_158 [8];
  AnnotationMap a;
  undefined1 auStack_f8 [8];
  vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_> outNodes;
  __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
  _Stack_d8;
  __normal_iterator<const_chatra::Token_*const_*,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
  it;
  allocator local_a9;
  undefined1 auStack_a8 [8];
  shared_ptr<chatra::Node> n;
  __node_base_ptr ap_Stack_78 [2];
  undefined1 auStack_68 [8];
  vector<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
  stack;
  undefined1 local_48 [8];
  ParserContext ct;
  
  local_248 = (undefined1  [8])&aMap._M_h._M_rehash_policy._M_next_resize;
  aMap._M_h._M_buckets = (__buckets_ptr)0x1;
  aMap._M_h._M_bucket_count = 0;
  aMap._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  aMap._M_h._M_element_count._0_4_ = 0x3f800000;
  aMap._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  aMap._M_h._M_rehash_policy._4_4_ = 0;
  aMap._M_h._M_rehash_policy._M_next_resize = 0;
  auStack_198 = (undefined1  [8])0x0;
  pending.
  super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pending.
  super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a0 = &node->blockNodes;
  __position._M_current =
       (node->blockNodes).
       super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1b8 = sTable;
  local_1b0 = errorReceiver;
  local_1a8 = ws;
  pending.
  super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)node;
  local_48 = (undefined1  [8])ws;
  ct.ws = (ParserWorkingSet *)errorReceiver;
  ct.errorReceiver = (IErrorReceiver *)sTable;
  while (__position._M_current !=
         (node->blockNodes).
         super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) {
    auStack_158 = (undefined1  [8])&a._M_h._M_rehash_policy._M_next_resize;
    a._M_h._M_buckets = (__buckets_ptr)0x1;
    a._M_h._M_bucket_count = 0;
    a._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    a._M_h._M_element_count._0_4_ = 0x3f800000;
    outNodes.
    super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    a._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    a._M_h._M_rehash_policy._4_4_ = 0;
    a._M_h._M_rehash_policy._M_next_resize = 0;
    auStack_f8 = (undefined1  [8])0x0;
    outNodes.
    super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    peVar17 = ((__position._M_current)->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>
              )._M_ptr;
    __first._M_current =
         (peVar17->tokens).
         super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    while (ppTVar2 = (peVar17->tokens).
                     super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish, __first._M_current != ppTVar2) {
      if (((long)ppTVar2 - (long)__first._M_current < 9) ||
         (pTVar3 = *__first._M_current, pTVar3->sid != Annotation)) {
        if (auStack_f8 !=
            (undefined1  [8])
            outNodes.
            super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          std::
          _Hashtable<void_const*,std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>,std::allocator<std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::
          _M_emplace<chatra::Token_const*&,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>&>
                    ((_Hashtable<void_const*,std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>,std::allocator<std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)auStack_158,__first._M_current,
                     (vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                      *)auStack_f8);
          std::
          vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
          clear((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                 *)auStack_f8);
        }
        __first._M_current = __first._M_current + 1;
      }
      else {
        _Var28._M_current = __first._M_current + 1;
        if (__first._M_current[1]->type != Name) {
          if (__first._M_current[1]->sid == OpenBrace) {
            first._M_current = __first._M_current + 2;
            local_1e0 = _Var28._M_current;
            if (first._M_current != ppTVar2) {
              stack.
              super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              auStack_68 = (undefined1  [8])0x0;
              stack.
              super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              for (lVar27 = 0x10; __args_1 = __first._M_current + lVar27, __args_1 != ppTVar2;
                  lVar27 = lVar27 + 8) {
                pTVar3 = *__args_1;
                if ((auStack_68 ==
                     (undefined1  [8])
                     stack.
                     super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) && (pTVar3->sid == CloseBrace))
                goto LAB_001795f8;
                if (pTVar3->type == CloseBracket) {
                  SVar1 = pTVar3->sid;
                  if (SVar1 == CloseBrace) {
                    bVar15 = checkBracketPair((ParserContext *)local_48,pTVar3,
                                              (vector<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                               *)auStack_68,OpenBrace);
                  }
                  else if (SVar1 == CloseBracket) {
                    bVar15 = checkBracketPair((ParserContext *)local_48,pTVar3,
                                              (vector<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                               *)auStack_68,OpenBracket);
                  }
                  else {
                    if (SVar1 != CloseParenthesis) {
                      std::__cxx11::string::string
                                ((string *)auStack_a8,"internal error",(allocator *)&local_178);
                      _Stack_d8._M_current = (Token **)0x0;
                      it._M_current = (Token **)0x0;
                      ParserContext::errorAtToken
                                ((ParserContext *)local_48,Error,pTVar3,(string *)auStack_a8,
                                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&stack0xffffffffffffff28);
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&stack0xffffffffffffff28);
                      std::__cxx11::string::~string((string *)auStack_a8);
                      puVar21 = (undefined8 *)__cxa_allocate_exception(8);
                      *puVar21 = &PTR__exception_0023d4d0;
                      __cxa_throw(puVar21,&AbortCompilingException::typeinfo,
                                  std::exception::~exception);
                    }
                    bVar15 = checkBracketPair((ParserContext *)local_48,pTVar3,
                                              (vector<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                                               *)auStack_68,OpenParenthesis);
                  }
                  if (bVar15 == false) goto LAB_001795f4;
                }
                else if (pTVar3->type == OpenBracket) {
                  std::
                  vector<std::pair<chatra::StringId,chatra::Token_const*>,std::allocator<std::pair<chatra::StringId,chatra::Token_const*>>>
                  ::emplace_back<chatra::StringId_const&,chatra::Token_const*&>
                            ((vector<std::pair<chatra::StringId,chatra::Token_const*>,std::allocator<std::pair<chatra::StringId,chatra::Token_const*>>>
                              *)auStack_68,&pTVar3->sid,__args_1);
                }
              }
              if (auStack_68 !=
                  (undefined1  [8])
                  stack.
                  super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
                _Var28._M_current = __first._M_current + lVar27 + -8;
                if (lVar27 == 0x10) {
                  _Var28._M_current = first._M_current;
                }
                pTVar3 = *_Var28._M_current;
                std::__cxx11::string::string((string *)&local_178,"unmatched \'",&local_a9);
                StringTable::ref_abi_cxx11_
                          ((string *)&local_200,
                           (StringTable *)(ct.errorReceiver)->_vptr_IErrorReceiver,
                           stack.
                           super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].first);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &stack0xffffffffffffff28,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_178,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_200);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               auStack_a8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &stack0xffffffffffffff28,"\'");
                local_1d8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_1d8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                local_1d8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                ParserContext::errorAtNextToken
                          ((ParserContext *)local_48,Error,pTVar3,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           auStack_a8,&local_1d8);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_1d8);
                std::__cxx11::string::~string((string *)auStack_a8);
                std::__cxx11::string::~string((string *)&stack0xffffffffffffff28);
                std::__cxx11::string::~string((string *)&local_200);
                std::__cxx11::string::~string((string *)&local_178);
LAB_001795f4:
                lVar27 = 0x10;
              }
LAB_001795f8:
              std::
              _Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
              ::~_Vector_base((_Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                               *)auStack_68);
              if (((lVar27 != 0x10) &&
                  (_Var28._M_current = lVar27 + __first._M_current,
                  _Var28._M_current !=
                  ((((__position._M_current)->
                    super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->tokens).
                  super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish)) &&
                 ((*_Var28._M_current)->sid == CloseBrace)) {
                this = &aMap._M_h._M_single_bucket;
                parseExpression<__gnu_cxx::__normal_iterator<chatra::Token_const**,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>>
                          ((chatra *)this,(ParserContext *)local_48,first,_Var28);
                wrapByTuple((chatra *)auStack_a8,(shared_ptr<chatra::Node> *)this,(Token *)0x0);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_208);
                std::
                vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>
                ::
                insert<__gnu_cxx::__normal_iterator<std::shared_ptr<chatra::Node>const*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>,void>
                          ((vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>
                            *)auStack_f8,
                           (const_iterator)
                           outNodes.
                           super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           (((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                              *)((long)auStack_a8 + 0x60))->
                           super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                           )._M_impl.super__Vector_impl_data._M_start,
                           *(pointer *)((long)auStack_a8 + 0x68));
                __first = std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>
                          ::erase(&(((__position._M_current)->
                                    super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>).
                                   _M_ptr)->tokens,__first._M_current,_Var28._M_current + 1);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&n);
                goto LAB_0017942c;
              }
            }
            pTVar3 = *local_1e0;
            std::__cxx11::string::string
                      ((string *)auStack_a8,"expected annotation",(allocator *)&local_178);
            _Stack_d8._M_current = (Token **)0x0;
            it._M_current = (Token **)0x0;
            ParserContext::errorAtNextToken
                      ((ParserContext *)local_48,Error,pTVar3,(string *)auStack_a8,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&stack0xffffffffffffff28);
          }
          else {
            std::__cxx11::string::string
                      ((string *)auStack_a8,"expected annotation name or \"{\"",
                       (allocator *)&local_178);
            _Stack_d8._M_current = (Token **)0x0;
            it._M_current = (Token **)0x0;
            ParserContext::errorAtToken
                      ((ParserContext *)local_48,Error,pTVar3,(string *)auStack_a8,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&stack0xffffffffffffff28);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&stack0xffffffffffffff28);
          std::__cxx11::string::~string((string *)auStack_a8);
          break;
        }
        parseExpression<__gnu_cxx::__normal_iterator<chatra::Token_const**,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>>
                  ((chatra *)auStack_a8,(ParserContext *)local_48,_Var28,
                   (__normal_iterator<const_chatra::Token_**,_std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>_>
                    )(__first._M_current + 2));
        std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>::
        emplace_back<std::shared_ptr<chatra::Node>>
                  ((vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>
                    *)auStack_f8,(shared_ptr<chatra::Node> *)auStack_a8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&n);
        __first = std::vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>::erase
                            (&(((__position._M_current)->
                               super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                              ->tokens,__first._M_current,__first._M_current + 2);
      }
LAB_0017942c:
      peVar17 = ((__position._M_current)->
                super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    }
    node = (Node *)pending.
                   super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (auStack_f8 !=
        (undefined1  [8])
        outNodes.
        super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      if (a._M_h._M_before_begin._M_nxt == (_Hash_node_base *)0x0) {
        auStack_a8 = (undefined1  [8])0x0;
        std::
        _Hashtable<void_const*,std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>,std::allocator<std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::
        _M_emplace<decltype(nullptr),std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>
                  ((_Hashtable<void_const*,std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>,std::allocator<std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)auStack_158,auStack_a8,auStack_f8);
      }
      else {
        pTVar3 = *(((__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2> *)auStack_f8)->_M_ptr->
                  tokens).
                  super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pTVar4 = ((outNodes.
                   super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[-1].
                   super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->tokens).
                 super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish[-1];
        std::__cxx11::string::string
                  ((string *)auStack_a8,"expected target of annotation",(allocator *)&local_178);
        _Stack_d8._M_current = (Token **)0x0;
        it._M_current = (Token **)0x0;
        ParserContext::errorAtToken
                  ((ParserContext *)local_48,Error,pTVar3,pTVar4,(string *)auStack_a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&stack0xffffffffffffff28);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&stack0xffffffffffffff28);
        std::__cxx11::string::~string((string *)auStack_a8);
      }
    }
    std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
    ~vector((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
             *)auStack_f8);
    if ((a._M_h._M_before_begin._M_nxt == (_Hash_node_base *)0x0) ||
       (peVar17 = ((__position._M_current)->
                  super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
       (peVar17->tokens).
       super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>._M_impl.
       super__Vector_impl_data._M_start !=
       (peVar17->tokens).
       super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>._M_impl.
       super__Vector_impl_data._M_finish)) {
      if (auStack_198 !=
          (undefined1  [8])
          pending.
          super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        auStack_a8 = (undefined1  [8])
                     ((__position._M_current)->
                     super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        std::
        _Hashtable<void_const*,std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>,std::allocator<std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::
        _M_emplace<chatra::Node*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>&>
                  ((_Hashtable<void_const*,std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>,std::allocator<std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)local_248,auStack_a8,
                   (vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>
                    *)auStack_198);
        std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
        ::clear((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                 *)auStack_198);
      }
      std::__detail::
      _Insert_base<void_const*,std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>,std::allocator<std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      insert<std::__detail::_Node_const_iterator<std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>,false,false>>
                ((_Insert_base<void_const*,std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>,std::allocator<std::pair<void_const*const,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)local_248,
                 (_Node_const_iterator<std::pair<const_void_*const,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>,_false,_false>
                  )a._M_h._M_bucket_count,
                 (_Node_const_iterator<std::pair<const_void_*const,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>,_false,_false>
                  )0x0);
      __position._M_current = __position._M_current + 1;
    }
    else {
      __position = std::
                   vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                   ::erase(local_1a0,(const_iterator)__position._M_current);
      _Stack_d8._M_current = (Token **)0x0;
      pmVar16 = std::__detail::
                _Map_base<const_void_*,_std::pair<const_void_*const,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>,_std::allocator<std::pair<const_void_*const,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<const_void_*,_std::pair<const_void_*const,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>,_std::allocator<std::pair<const_void_*const,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)auStack_158,&stack0xffffffffffffff28._M_current);
      std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
      vector((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
              *)auStack_a8,pmVar16);
      std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>::
      insert<__gnu_cxx::__normal_iterator<std::shared_ptr<chatra::Node>const*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>,void>
                ((vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>
                  *)auStack_198,
                 (const_iterator)
                 pending.
                 super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<const_std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                  )auStack_a8,
                 (__normal_iterator<const_std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                  )n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
      ~vector((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
               *)auStack_a8);
    }
    std::
    _Hashtable<const_void_*,_std::pair<const_void_*const,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>,_std::allocator<std::pair<const_void_*const,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<const_void_*,_std::pair<const_void_*const,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>,_std::allocator<std::pair<const_void_*const,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)auStack_158);
  }
  std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
  ~vector((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_> *)
          auStack_198);
  replaceSyntaxSugar((ParserContext *)local_48,(AnnotationMap *)local_248,node);
  auStack_f8 = (undefined1  [8])0x0;
  outNodes.
  super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  outNodes.
  super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  n_00 = (node->blockNodes).
         super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  psVar5 = (node->blockNodes).
           super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (n_00 == psVar5) {
      std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
      operator=(local_1a0,
                (vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                 *)auStack_f8);
      auStack_a8 = (undefined1  [8])ap_Stack_78;
      n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x1;
      n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      ap_Stack_78[0] = (__node_base_ptr)0x0;
      psVar18 = &aMap._M_h._M_bucket_count;
      while (psVar18 = (size_type *)*psVar18, psVar18 != (size_type *)0x0) {
        auStack_158 = (undefined1  [8])0xffffffffffffffff;
        a._M_h._M_buckets = (__buckets_ptr)0x0;
        std::
        _Hashtable<void_const*,std::pair<void_const*const,std::pair<unsigned_long,std::shared_ptr<chatra::Node>>>,std::allocator<std::pair<void_const*const,std::pair<unsigned_long,std::shared_ptr<chatra::Node>>>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<void_const*const&,std::pair<unsigned_long,decltype(nullptr)>>
                  ((_Hashtable<void_const*,std::pair<void_const*const,std::pair<unsigned_long,std::shared_ptr<chatra::Node>>>,std::allocator<std::pair<void_const*const,std::pair<unsigned_long,std::shared_ptr<chatra::Node>>>>,std::__detail::_Select1st,std::equal_to<void_const*>,std::hash<void_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)auStack_a8,(__node_base *)(psVar18 + 1),auStack_158);
      }
      std::
      _Deque_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
      _Deque_base((_Deque_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                   *)auStack_158);
      peVar12 = pending.
                super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage[5].
                super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      for (peVar17 = (element_type *)
                     pending.
                     super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage[4].
                     super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
          peVar17 != peVar12;
          peVar17 = (element_type *)
                    &(peVar17->line).super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount) {
        std::deque<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
        push_back((deque<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                   *)auStack_158,(value_type *)peVar17);
        peVar13 = ((__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2> *)&peVar17->type)->_M_ptr
        ;
        if ((peVar13 != (element_type *)0x0) && (peVar13->type == IfGroup)) {
          _Stack_d8._M_current = (Token **)a._M_h._M_rehash_policy._M_next_resize;
          it._M_current = (Token **)a._M_h._M_single_bucket;
          std::deque<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>::
          insert<__gnu_cxx::__normal_iterator<std::shared_ptr<chatra::Node>const*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>,void>
                    (&local_178,
                     (deque<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>
                      *)auStack_158,(const_iterator *)&stack0xffffffffffffff28,
                     (peVar13->blockNodes).
                     super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (peVar13->blockNodes).
                     super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
        }
      }
      while (a._M_h._M_rehash_policy._M_next_resize != a._M_h._M_bucket_count) {
        p_Var19 = &std::
                   _Deque_iterator<std::shared_ptr<chatra::Node>,_std::shared_ptr<chatra::Node>_&,_std::shared_ptr<chatra::Node>_*>
                   ::operator[]((_Deque_iterator<std::shared_ptr<chatra::Node>,_std::shared_ptr<chatra::Node>_&,_std::shared_ptr<chatra::Node>_*>
                                 *)&a._M_h._M_bucket_count,0)->
                   super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>;
        std::__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2> *)auStack_68,p_Var19);
        std::deque<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
        pop_front((deque<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                   *)auStack_158);
        if (auStack_68 != (undefined1  [8])0x0) {
          local_200._M_cur = (_Elt_pointer)auStack_68;
          iVar20 = std::
                   _Hashtable<const_void_*,_std::pair<const_void_*const,_std::pair<unsigned_long,_std::shared_ptr<chatra::Node>_>_>,_std::allocator<std::pair<const_void_*const,_std::pair<unsigned_long,_std::shared_ptr<chatra::Node>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find((_Hashtable<const_void_*,_std::pair<const_void_*const,_std::pair<unsigned_long,_std::shared_ptr<chatra::Node>_>_>,_std::allocator<std::pair<const_void_*const,_std::pair<unsigned_long,_std::shared_ptr<chatra::Node>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           *)auStack_a8,&local_200._M_cur);
          if (iVar20.
              super__Node_iterator_base<std::pair<const_void_*const,_std::pair<unsigned_long,_std::shared_ptr<chatra::Node>_>_>,_false>
              ._M_cur != (__node_type *)0x0) {
            *(undefined8 *)
             ((long)iVar20.
                    super__Node_iterator_base<std::pair<const_void_*const,_std::pair<unsigned_long,_std::shared_ptr<chatra::Node>_>_>,_false>
                    ._M_cur + 0x10) = 0;
            std::__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>::operator=
                      ((__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2> *)
                       ((long)iVar20.
                              super__Node_iterator_base<std::pair<const_void_*const,_std::pair<unsigned_long,_std::shared_ptr<chatra::Node>_>_>,_false>
                              ._M_cur + 0x18),
                       (__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2> *)auStack_68);
          }
          ppTVar14 = (((vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_> *)
                      ((long)auStack_68 + 0x18))->
                     super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          for (ppTVar24 = (((vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_> *
                            )((long)auStack_68 + 0x18))->
                          super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>
                          )._M_impl.super__Vector_impl_data._M_start; ppTVar24 != ppTVar14;
              ppTVar24 = ppTVar24 + 1) {
            local_200._M_cur = (_Elt_pointer)*ppTVar24;
            iVar20 = std::
                     _Hashtable<const_void_*,_std::pair<const_void_*const,_std::pair<unsigned_long,_std::shared_ptr<chatra::Node>_>_>,_std::allocator<std::pair<const_void_*const,_std::pair<unsigned_long,_std::shared_ptr<chatra::Node>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find((_Hashtable<const_void_*,_std::pair<const_void_*const,_std::pair<unsigned_long,_std::shared_ptr<chatra::Node>_>_>,_std::allocator<std::pair<const_void_*const,_std::pair<unsigned_long,_std::shared_ptr<chatra::Node>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                             *)auStack_a8,&local_200._M_cur);
            if ((iVar20.
                 super__Node_iterator_base<std::pair<const_void_*const,_std::pair<unsigned_long,_std::shared_ptr<chatra::Node>_>_>,_false>
                 ._M_cur != (__node_type *)0x0) &&
               (uVar23 = (long)(((vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>
                                  *)((long)auStack_68 + 0x18))->
                               super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(((vector<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>
                                  *)((long)auStack_68 + 0x18))->
                               super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>
                               )._M_impl.super__Vector_impl_data._M_start >> 3,
               uVar23 <= *(ulong *)((long)iVar20.
                                          super__Node_iterator_base<std::pair<const_void_*const,_std::pair<unsigned_long,_std::shared_ptr<chatra::Node>_>_>,_false>
                                          ._M_cur + 0x10))) {
              *(ulong *)((long)iVar20.
                               super__Node_iterator_base<std::pair<const_void_*const,_std::pair<unsigned_long,_std::shared_ptr<chatra::Node>_>_>,_false>
                               ._M_cur + 0x10) = uVar23;
              std::__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>::operator=
                        ((__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2> *)
                         ((long)iVar20.
                                super__Node_iterator_base<std::pair<const_void_*const,_std::pair<unsigned_long,_std::shared_ptr<chatra::Node>_>_>,_false>
                                ._M_cur + 0x18),
                         (__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2> *)auStack_68);
            }
          }
          local_178._M_cur = (_Elt_pointer)a._M_h._M_rehash_policy._M_next_resize;
          local_178._M_first = (_Elt_pointer)a._M_h._M_single_bucket;
          std::deque<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>::
          insert<__gnu_cxx::__normal_iterator<std::shared_ptr<chatra::Node>const*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>,void>
                    (&local_200,
                     (deque<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>
                      *)auStack_158,(const_iterator *)&local_178,
                     (((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                        *)((long)auStack_68 + 0x60))->
                     super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,
                     (((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                        *)((long)auStack_68 + 0x60))->
                     super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack);
      }
      for (_Var26._M_pi = n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                          ._M_pi;
          _Var26._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          _Var26._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         (_Var26._M_pi)->_vptr__Sp_counted_base) {
        pmVar16 = std::__detail::
                  _Map_base<const_void_*,_std::pair<const_void_*const,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>,_std::allocator<std::pair<const_void_*const,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<const_void_*,_std::pair<const_void_*const,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>,_std::allocator<std::pair<const_void_*const,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)local_248,(key_type *)&(_Var26._M_pi)->_M_use_count);
        std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
        ::vector((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                  *)auStack_68,pmVar16);
        if (_Var26._M_pi[1]._vptr__Sp_counted_base == (_func_int **)0xffffffffffffffff) {
          pTVar3 = *(((__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2> *)auStack_68)->_M_ptr
                    ->tokens).
                    super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          std::__cxx11::string::string
                    ((string *)&local_200,
                     "no entity found associated with the annotations start from here",
                     (allocator *)auStack_198);
          local_1d8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_1d8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1d8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ParserContext::errorAtToken
                    ((ParserContext *)local_48,Error,pTVar3,(string *)&local_200,&local_1d8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_1d8);
          std::__cxx11::string::~string((string *)&local_200);
        }
        else {
          std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>::
          insert<__gnu_cxx::__normal_iterator<std::shared_ptr<chatra::Node>const*,std::vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>>,void>
                    ((vector<std::shared_ptr<chatra::Node>,std::allocator<std::shared_ptr<chatra::Node>>>
                      *)(*(long *)&_Var26._M_pi[1]._M_use_count + 0x78),
                     *(shared_ptr<chatra::Node> **)(*(long *)&_Var26._M_pi[1]._M_use_count + 0x80),
                     (__normal_iterator<const_std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                      )auStack_68,
                     (__normal_iterator<const_std::shared_ptr<chatra::Node>_*,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>
                      )stack.
                       super__Vector_base<std::pair<chatra::StringId,_const_chatra::Token_*>,_std::allocator<std::pair<chatra::StringId,_const_chatra::Token_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
        }
        std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
        ::~vector((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                   *)auStack_68);
      }
      std::deque<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
      ~deque((deque<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
              *)auStack_158);
      std::
      _Hashtable<const_void_*,_std::pair<const_void_*const,_std::pair<unsigned_long,_std::shared_ptr<chatra::Node>_>_>,_std::allocator<std::pair<const_void_*const,_std::pair<unsigned_long,_std::shared_ptr<chatra::Node>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<const_void_*,_std::pair<const_void_*const,_std::pair<unsigned_long,_std::shared_ptr<chatra::Node>_>_>,_std::allocator<std::pair<const_void_*const,_std::pair<unsigned_long,_std::shared_ptr<chatra::Node>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)auStack_a8);
      if (recursive) {
        peVar12 = pending.
                  super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage[5].
                  super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        for (peVar17 = (element_type *)
                       pending.
                       super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage[4].
                       super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                       _M_pi; peVar17 != peVar12;
            peVar17 = (element_type *)
                      &(peVar17->line).super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount) {
          parseInnerNode(local_1a8,local_1b0,local_1b8,*(Node **)&peVar17->type,true);
          LOCK();
          *(undefined4 *)((long)*(_func_int ***)&peVar17->type + 0x44) = 2;
          UNLOCK();
        }
      }
      std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
      ~vector((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
               *)auStack_f8);
      std::
      _Hashtable<const_void_*,_std::pair<const_void_*const,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>,_std::allocator<std::pair<const_void_*const,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<const_void_*,_std::pair<const_void_*const,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>,_std::allocator<std::pair<const_void_*const,_std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)local_248);
      return;
    }
    peVar17 = (n_00->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    psVar25 = (size_type *)((ulong)peVar17->type * 0x28 + stAttrs._0_8_);
    peVar6 = (peVar17->line).super___shared_ptr<chatra::Line,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar6 != (element_type *)0x0) && (peVar6->containsError == true)) {
      std::__cxx11::string::string
                ((string *)auStack_158,
                 "interpreter reached at the line which contains error on lexical analysis",
                 (allocator *)&stack0xffffffffffffff28);
      auStack_a8 = (undefined1  [8])0x0;
      n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      ParserContext::errorAtLine
                ((ParserContext *)local_48,Error,&peVar17->line,(string *)auStack_158,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)auStack_a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)auStack_a8);
      std::__cxx11::string::~string((string *)auStack_158);
      puVar21 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar21 = &PTR__exception_0023d4d0;
      __cxa_throw(puVar21,&AbortCompilingException::typeinfo,std::exception::~exception);
    }
    std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
    resize(&peVar17->subNodes,*psVar25);
    _Stack_d8._M_current =
         (((n_00->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->tokens).
         super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>._M_impl.
         super__Vector_impl_data._M_start + psVar25[1];
    puVar7 = (undefined1 *)psVar25[3];
    message = (string *)(psVar25[2] + 0x18);
    while( true ) {
      peVar17 = (n_00->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      last._M_current =
           (peVar17->tokens).
           super__Vector_base<const_chatra::Token_*,_std::allocator<const_chatra::Token_*>_>._M_impl
           .super__Vector_impl_data._M_finish;
      if (&message[-1]._M_string_length == (size_type *)puVar7) break;
      if (_Stack_d8._M_current == last._M_current) {
        if (message[-1].field_2._M_local_buf[0] == '\x01') {
          auStack_158 = (undefined1  [8])0x0;
          a._M_h._M_buckets = (__buckets_ptr)0x0;
          a._M_h._M_bucket_count = 0;
          ParserContext::errorAtNextToken
                    ((ParserContext *)local_48,Error,last._M_current[-1],message,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)auStack_158);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)auStack_158);
          goto LAB_00179dcb;
        }
      }
      else {
        extractStatementPiece<__gnu_cxx::__normal_iterator<chatra::Token_const*const*,std::vector<chatra::Token_const*,std::allocator<chatra::Token_const*>>>>
                  ((chatra *)auStack_158,(ParserContext *)local_48,&stack0xffffffffffffff28,last,
                   (StatementPatternElement *)&message[-1]._M_string_length);
        if (auStack_158 == (undefined1  [8])0x0) {
          if (message[-1].field_2._M_local_buf[0] == '\x01') {
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&a);
            goto LAB_00179dcb;
          }
        }
        else {
          lVar27 = *(long *)((long)&message[-1].field_2 + 8);
          if (lVar27 != -1) {
            std::__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>::operator=
                      (&(((n_00->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr)->subNodes).
                        super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar27].
                        super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>,
                       (__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2> *)auStack_158);
          }
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&a);
      }
      message = (string *)((long)&message[1].field_2 + 8);
    }
    if (_Stack_d8._M_current != last._M_current) {
      pTVar3 = *_Stack_d8._M_current;
      std::__cxx11::string::string((string *)auStack_158,"extra token",(allocator *)&local_178);
      auStack_a8 = (undefined1  [8])0x0;
      n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      ParserContext::errorAtToken
                ((ParserContext *)local_48,Error,pTVar3,(string *)auStack_158,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)auStack_a8);
      goto LAB_00179abe;
    }
    NVar22 = peVar17->type;
    if (NVar22 == Def) {
      std::__cxx11::string::string
                ((string *)auStack_158,"expected \".name(parameters)\"",(allocator *)auStack_a8);
      bVar15 = checkCombination((ParserContext *)local_48,n_00,4,5,(string *)auStack_158);
      std::__cxx11::string::~string((string *)auStack_158);
      if (bVar15) {
        peVar17 = (n_00->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        NVar22 = peVar17->type;
        goto LAB_00179b1d;
      }
    }
    else {
LAB_00179b1d:
      if (NVar22 == Class) {
        std::__cxx11::string::string
                  ((string *)auStack_158,"expected \"extends base-classes,...\"",
                   (allocator *)auStack_a8);
        bVar15 = checkCombination((ParserContext *)local_48,n_00,2,3,(string *)auStack_158);
        std::__cxx11::string::~string((string *)auStack_158);
        if (!bVar15) goto LAB_00179dcb;
        peVar17 = (n_00->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        NVar22 = peVar17->type;
      }
      if (NVar22 == Def) {
        psVar8 = (peVar17->subNodes).
                 super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar27 = *(long *)&psVar8[6].super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>;
        if (lVar27 != 0) {
          psVar9 = (peVar17->blockNodes).
                   super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (psVar9 == (peVar17->blockNodes).
                        super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) {
            if (1 < peVar17->sid - Init) goto LAB_00179c73;
            pTVar3 = (Token *)**(undefined8 **)(lVar27 + 0x18);
            std::__cxx11::string::string
                      ((string *)auStack_158,"\"init\" and \"deinit\" cannot be deleted method",
                       (allocator *)&local_178);
            auStack_a8 = (undefined1  [8])0x0;
            n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            ParserContext::errorAtToken
                      ((ParserContext *)local_48,Error,pTVar3,(string *)auStack_158,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)auStack_a8);
          }
          else {
            peVar17 = (psVar9->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            std::__cxx11::string::string
                      ((string *)auStack_158,"deleted method cannot have nested block",
                       (allocator *)&local_178);
            auStack_a8 = (undefined1  [8])0x0;
            n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            ParserContext::errorAtLine
                      ((ParserContext *)local_48,Error,&peVar17->line,(string *)auStack_158,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)auStack_a8);
          }
LAB_00179abe:
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)auStack_a8);
          std::__cxx11::string::~string((string *)auStack_158);
          goto LAB_00179dcb;
        }
LAB_00179c73:
        lVar27 = *(long *)&psVar8->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>;
        if (lVar27 != 0) {
          pTVar3 = (Token *)**(undefined8 **)(lVar27 + 0x18);
          std::__cxx11::string::string
                    ((string *)auStack_158,
                     "static qualifier is reserved keyword, currently not working",
                     (allocator *)&local_178);
          auStack_a8 = (undefined1  [8])0x0;
          n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          ParserContext::errorAtToken
                    ((ParserContext *)local_48,Warning,pTVar3,(string *)auStack_158,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)auStack_a8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)auStack_a8);
          std::__cxx11::string::~string((string *)auStack_158);
          peVar17 = (n_00->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          NVar22 = peVar17->type;
          goto LAB_00179cd8;
        }
LAB_00179d4b:
        lVar27 = *(long *)&(peVar17->subNodes).
                           super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[7].
                           super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>;
        if (lVar27 != 0) {
          puVar10 = *(undefined8 **)(lVar27 + 0x68);
          for (puVar21 = *(undefined8 **)(lVar27 + 0x60); puVar21 != puVar10; puVar21 = puVar21 + 2)
          {
            pcVar11 = (char *)*puVar21;
            if ((*pcVar11 != '\x1b') || (*(int *)(pcVar11 + 0x34) != 0x67)) {
              pTVar3 = (Token *)**(undefined8 **)(pcVar11 + 0x18);
              pTVar4 = *(Token **)(*(long *)(pcVar11 + 0x20) + -8);
              std::__cxx11::string::string
                        ((string *)auStack_158,"expected qualifiers",(allocator *)&local_178);
              auStack_a8 = (undefined1  [8])0x0;
              n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              ParserContext::errorAtToken
                        ((ParserContext *)local_48,Error,pTVar3,pTVar4,(string *)auStack_158,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)auStack_a8);
              goto LAB_00179abe;
            }
            *(byte *)&peVar17->flags = (byte)peVar17->flags | 1;
          }
        }
      }
      else {
LAB_00179cd8:
        if (NVar22 == Class) {
          lVar27 = *(long *)&((peVar17->subNodes).
                              super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                             super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>;
          if (lVar27 != 0) {
            pTVar3 = (Token *)**(undefined8 **)(lVar27 + 0x18);
            std::__cxx11::string::string
                      ((string *)auStack_158,
                       "static qualifier is reserved keyword, currently not working",
                       (allocator *)&local_178);
            auStack_a8 = (undefined1  [8])0x0;
            n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            n.super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            ParserContext::errorAtToken
                      ((ParserContext *)local_48,Warning,pTVar3,(string *)auStack_158,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)auStack_a8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)auStack_a8);
            std::__cxx11::string::~string((string *)auStack_158);
            peVar17 = (n_00->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            NVar22 = peVar17->type;
            goto LAB_00179d46;
          }
        }
        else {
LAB_00179d46:
          if (NVar22 == Def) goto LAB_00179d4b;
        }
      }
      std::vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>::
      push_back((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                 *)auStack_f8,n_00);
      if (!recursive) {
        node_00 = (n_00->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        NVar22 = node_00->type;
        if ((NVar22 == IfGroup) || (NVar22 == Sync)) {
          parseInnerNode(local_1a8,local_1b0,local_1b8,node_00,false);
          LOCK();
          (((n_00->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
          blockNodesState)._M_i = Parsed;
          UNLOCK();
        }
      }
    }
LAB_00179dcb:
    n_00 = n_00 + 1;
  } while( true );
}

Assistant:

void parseInnerNode(ParserWorkingSet& ws, IErrorReceiver& errorReceiver,
		std::shared_ptr<StringTable>& sTable, Node* node, bool recursive) {

	chatra_assert(node->blockNodes.empty() || node->blockNodesState == NodeState::Structured);

	ParserContext ct(&ws, errorReceiver, sTable);

	auto aMap = parseInnerAnnotations(ct, node);
	replaceSyntaxSugar(ct, aMap, node);

	std::vector<std::shared_ptr<Node>> outNodes;
	for (auto& n : node->blockNodes) {
		auto& attr = getStAttr(n->type);

		if (n->line && n->line->containsError) {
			ct.errorAtLine(ErrorLevel::Error, n->line, "interpreter reached at the line which contains error on lexical analysis", {});
			throw AbortCompilingException();
		}

		// Parse subNodes
		n->subNodes.resize(attr.subNodes);

		auto it = n->tokens.cbegin() + attr.skipTokens;
		bool hasError = false;
		for (auto& e : attr.pattern) {
			if (it == n->tokens.cend()) {
				if (!e.required)
					continue;
				chatra_assert(!e.errorMessage.empty());
				ct.errorAtNextToken(ErrorLevel::Error, *n->tokens.back(), e.errorMessage, {});
				hasError = true;
				break;
			}

			auto subNode = extractStatementPiece(ct, it, n->tokens.cend(), e);
			if (subNode) {
				if (e.subNodeIndex != SIZE_MAX) {
					chatra_assert(e.subNodeIndex < n->subNodes.size() && !n->subNodes[e.subNodeIndex]);
					n->subNodes[e.subNodeIndex] = std::move(subNode);
				}
			}
			else if (e.required) {
				hasError = true;
				break;
			}
		}
		if (hasError)
			continue;

		if (it != n->tokens.cend()) {
			ct.errorAtToken(ErrorLevel::Error, **it, "extra token", {});
			continue;
		}

		// Combination check
		if (n->type == NodeType::Def && !checkCombination(ct, n,
				SubNode::Def_Operator, SubNode::Def_OperatorParameter, "expected \".name(parameters)\""))
			continue;
		if (n->type == NodeType::Class && !checkCombination(ct, n,
				SubNode::Class_Extends, SubNode::Class_BaseClassList, "expected \"extends base-classes,...\""))
			continue;
		if (n->type == NodeType::Def && n->subNodes[SubNode::Def_Delete] && !n->blockNodes.empty()) {
			ct.errorAtLine(ErrorLevel::Error, n->blockNodes[0]->line, "deleted method cannot have nested block", {});
			continue;
		}
		if (n->type == NodeType::Def && n->subNodes[SubNode::Def_Delete] &&
				(n->sid == StringId::Init || n->sid == StringId::Deinit)) {
			ct.errorAtToken(ErrorLevel::Error, *n->subNodes[SubNode::Def_Delete]->tokens[0],
					R"("init" and "deinit" cannot be deleted method)", {});
			continue;
		}
		if (n->type == NodeType::Def && n->subNodes[SubNode::Def_Static]) {
			ct.errorAtToken(ErrorLevel::Warning, *n->subNodes[SubNode::Def_Static]->tokens[0],
					"static qualifier is reserved keyword, currently not working", {});
		}
		if (n->type == NodeType::Class && n->subNodes[SubNode::Class_Static]) {
			ct.errorAtToken(ErrorLevel::Warning, *n->subNodes[SubNode::Class_Static]->tokens[0],
					"static qualifier is reserved keyword, currently not working", {});
		}

		// Additional process (set flags, etc)
		if (n->type == NodeType::Def && !qualifyDef(ct, n))
			continue;

		outNodes.push_back(n);

		if (!recursive) {
			if (n->type == NodeType::Sync || n->type == NodeType::IfGroup) {
				parseInnerNode(ws, errorReceiver, sTable, n.get(), false);
				n->blockNodesState = NodeState::Parsed;
			}
		}
	}

	node->blockNodes = outNodes;
	mapAnnotations(ct, aMap, node);

	if (recursive) {
		for (auto& n : node->blockNodes) {
			parseInnerNode(ws, errorReceiver, sTable, n.get(), true);
			n->blockNodesState = NodeState::Parsed;
		}
	}

	// node->blockNodesState = NodeState::Parsed;
}